

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

Test * ParserTestDefaultDefaultCycle::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x1e8);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__ParserTest_001d6190;
  State::State((State *)(pTVar1 + 1));
  *(undefined ***)&pTVar1[0x11].failed_ = &PTR__VirtualFileSystem_001d67b0;
  *(undefined4 *)&pTVar1[0x15].failed_ = 0;
  pTVar1[0x16]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x12]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x12].failed_ = false;
  *(undefined3 *)&pTVar1[0x12].field_0x9 = 0;
  pTVar1[0x12].assertion_failures_ = 0;
  pTVar1[0x13]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x13].failed_ = false;
  *(undefined3 *)&pTVar1[0x13].field_0x9 = 0;
  pTVar1[0x13].assertion_failures_ = 0;
  pTVar1[0x14]._vptr_Test = (_func_int **)0x0;
  pTVar1[0x14].failed_ = false;
  *(undefined3 *)&pTVar1[0x14].field_0x9 = 0;
  pTVar1[0x14].assertion_failures_ = 0;
  *(bool **)&pTVar1[0x16].failed_ = &pTVar1[0x15].failed_;
  pTVar1[0x17]._vptr_Test = (_func_int **)&pTVar1[0x15].failed_;
  pTVar1[0x17].failed_ = false;
  *(undefined3 *)&pTVar1[0x17].field_0x9 = 0;
  pTVar1[0x17].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x18].failed_ = 0;
  pTVar1[0x19]._vptr_Test = (_func_int **)0x0;
  *(bool **)&pTVar1[0x19].failed_ = &pTVar1[0x18].failed_;
  pTVar1[0x1a]._vptr_Test = (_func_int **)&pTVar1[0x18].failed_;
  pTVar1[0x1a].failed_ = false;
  *(undefined3 *)&pTVar1[0x1a].field_0x9 = 0;
  pTVar1[0x1a].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x1b].failed_ = 0;
  pTVar1[0x1c]._vptr_Test = (_func_int **)0x0;
  *(bool **)&pTVar1[0x1c].failed_ = &pTVar1[0x1b].failed_;
  pTVar1[0x1d]._vptr_Test = (_func_int **)&pTVar1[0x1b].failed_;
  pTVar1[0x1d].failed_ = false;
  *(undefined3 *)&pTVar1[0x1d].field_0x9 = 0;
  pTVar1[0x1d].assertion_failures_ = 0;
  *(undefined4 *)&pTVar1[0x1e]._vptr_Test = 1;
  pTVar1->_vptr_Test = (_func_int **)&PTR__ParserTest_001d5e58;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(ParserTest, DefaultDefaultCycle) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat a\n"));

  string err;
  EXPECT_EQ(0u, state.DefaultNodes(&err).size());
  EXPECT_EQ("could not determine root nodes of build graph", err);
}